

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O1

Status __thiscall leveldb::DBImpl::Get(DBImpl *this,ReadOptions *options,Slice *key,string *value)

{
  ReadOptions *this_00;
  SequenceNumber s;
  MemTable *this_01;
  VersionSet *pVVar1;
  bool bVar2;
  _func_int **pp_Var3;
  SequenceNumber *pSVar4;
  string *in_R8;
  GetStats stats;
  LookupKey lkey;
  undefined1 local_138 [40];
  LookupKey local_110;
  
  (this->super_DB)._vptr_DB = (_func_int **)0x0;
  this_00 = options + 0xc;
  port::Mutex::Lock((Mutex *)this_00);
  pSVar4 = (SequenceNumber *)(key->size_ + 8);
  if (key->size_ == 0) {
    pSVar4 = (SequenceNumber *)(*(long *)(options + 0x22) + 0x58);
  }
  s = *pSVar4;
  local_138._16_8_ = options[0x12].snapshot;
  this_01 = *(MemTable **)(options + 0x13);
  local_138._8_8_ = *(undefined8 *)(*(long *)(options + 0x22) + 0x168);
  *(int *)&((Version *)local_138._16_8_)->prev_ = *(int *)&((Version *)local_138._16_8_)->prev_ + 1;
  if (this_01 != (MemTable *)0x0) {
    this_01->refs_ = this_01->refs_ + 1;
  }
  Version::Ref((Version *)local_138._8_8_);
  port::Mutex::Unlock((Mutex *)this_00);
  LookupKey::LookupKey(&local_110,(Slice *)value,s);
  bVar2 = MemTable::Get((MemTable *)local_138._16_8_,&local_110,in_R8,(Status *)this);
  if (bVar2) {
LAB_0010a1a5:
    bVar2 = false;
  }
  else {
    if (this_01 != (MemTable *)0x0) {
      bVar2 = MemTable::Get(this_01,&local_110,in_R8,(Status *)this);
      if (bVar2) goto LAB_0010a1a5;
    }
    Version::Get((Version *)local_138,(ReadOptions *)local_138._8_8_,(LookupKey *)key,
                 (string *)&local_110,(GetStats *)in_R8);
    pVVar1 = (VersionSet *)(this->super_DB)._vptr_DB;
    if (pVVar1 != (VersionSet *)local_138._0_8_) {
      if (pVVar1 != (VersionSet *)0x0) {
        operator_delete__(pVVar1);
      }
      if ((VersionSet *)local_138._0_8_ == (VersionSet *)0x0) {
        pp_Var3 = (_func_int **)0x0;
      }
      else {
        pp_Var3 = (_func_int **)Status::CopyState((char *)local_138._0_8_);
      }
      (this->super_DB)._vptr_DB = pp_Var3;
    }
    if ((VersionSet *)local_138._0_8_ != (VersionSet *)0x0) {
      operator_delete__((void *)local_138._0_8_);
    }
    bVar2 = true;
  }
  port::Mutex::Lock((Mutex *)this_00);
  if ((pointer)local_110.start_ != (pointer)0x0 && local_110.start_ != local_110.space_) {
    operator_delete__(local_110.start_);
  }
  if (bVar2) {
    bVar2 = Version::UpdateStats((Version *)local_138._8_8_,(GetStats *)(local_138 + 0x18));
    if (bVar2) {
      MaybeScheduleCompaction((DBImpl *)options);
    }
  }
  MemTable::Unref((MemTable *)local_138._16_8_);
  if (this_01 != (MemTable *)0x0) {
    MemTable::Unref(this_01);
  }
  Version::Unref((Version *)local_138._8_8_);
  port::Mutex::Unlock((Mutex *)this_00);
  return (Status)(char *)this;
}

Assistant:

Status DBImpl::Get(const ReadOptions &options,
                   const Slice &key,
                   std::string *value) {
  Status s;
  MutexLock l(&mutex_);
  SequenceNumber snapshot;
  if (options.snapshot!=NULL) {
    snapshot = reinterpret_cast<const SnapshotImpl *>(options.snapshot)->number_;
  } else {
    snapshot = versions_->LastSequence();
  }

  MemTable *mem = mem_;
  MemTable *imm = imm_;
  Version *current = versions_->current();
  mem->Ref();
  if (imm!=NULL) imm->Ref();
  current->Ref();

  bool have_stat_update = false;
  Version::GetStats stats;

  // Unlock while reading from files and memtables
  {
    mutex_.Unlock();
    // First look in the memtable, then in the immutable memtable (if any).
    LookupKey lkey(key, snapshot);
    if (mem->Get(lkey, value, &s)) {
      // Done
    } else if (imm!=NULL && imm->Get(lkey, value, &s)) {
      // Done
    } else {
      s = current->Get(options, lkey, value, &stats);
      have_stat_update = true;
    }
    mutex_.Lock();
  }

  if (have_stat_update && current->UpdateStats(stats)) {
    MaybeScheduleCompaction();
  }
  mem->Unref();
  if (imm!=NULL) imm->Unref();
  current->Unref();
  return s;
}